

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O2

value_type * __thiscall
(anonymous_namespace)::
serialize_and_visit<(anonymous_namespace)::ToString,test::UnsignedLargeEnumClass>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,UnsignedLargeEnumClass *in
          )

{
  InputStream *in_R8;
  string_view tag_00;
  InputStream istream;
  OutputStream ostream;
  cx_string<86UL> tag;
  ToString visitor;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::serialize<test::UnsignedLargeEnumClass,OutputStream>
            ((UnsignedLargeEnumClass *)this,&ostream);
  anon_unknown.dwarf_d327d::ToString::ToString(&visitor);
  istream.stream = &stream;
  mserialize::CustomTag<test::UnsignedLargeEnumClass,_void>::tag_string();
  tag_00._len = (size_t)&visitor;
  tag_00._ptr = (char *)0x56;
  mserialize::visit<(anonymous_namespace)::ToString,InputStream>
            ((mserialize *)&tag,tag_00,(ToString *)&istream,in_R8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&visitor);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}